

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O1

pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
 __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
::newspace(DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
           *this)

{
  fstream *pfVar1;
  undefined1 *puVar2;
  long lVar3;
  _Ios_Seekdir _Var4;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  pVar5;
  locType offset_;
  locType offset;
  node tmp;
  long local_680;
  long local_678;
  undefined1 local_670 [1608];
  
  memset(local_670,0,0x648);
  pfVar1 = &(this->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            ).file;
  std::istream::seekg((long)pfVar1,_S_beg);
  std::istream::read((char *)pfVar1,(long)&local_678);
  puVar2 = &(this->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            ).field_0x18;
  std::ostream::seekp((long)puVar2,_S_beg);
  std::ios::clear((int)*(undefined8 *)
                        (*(long *)&(this->
                                   super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                                   ).file + -0x18) + (int)pfVar1);
  lVar3 = std::ostream::tellp();
  if (lVar3 == local_678) {
    std::ostream::write(puVar2,(long)local_670);
    local_680 = local_678 + 0x648;
    std::ostream::seekp((long)puVar2,_S_beg);
    std::ostream::write(puVar2,(long)local_670);
    _Var4 = 0xfffff9b8;
  }
  else {
    std::istream::seekg(pfVar1,local_678,0);
    std::istream::read((char *)pfVar1,(long)&local_680);
    _Var4 = _S_beg;
  }
  std::ostream::seekp((long)puVar2,_Var4);
  std::ostream::write(puVar2,(long)&local_680);
  pVar5.first = LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                ::load((this->
                       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                       ).cache,&local_678);
  pVar5.second = local_678;
  return pVar5;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			locType offset , offset_;T tmp;
			file.seekg(0 , std::ios_base::beg) , file.read(reinterpret_cast<char *> (&offset) , sizeof (locType));
			file.seekp(0 , std::ios_base::end) , file.clear();
			if (file.tellp() == offset)
			{
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				offset_ = offset + sizeof (T) , file.seekp(0 , std::ios_base::beg);
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(- sizeof (T) , std::ios_base::cur) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			else
			{
				file.seekg(offset) , file.read(reinterpret_cast<char *> (&offset_) , sizeof (locType));
				//file.seekp(offset) , file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(0 , std::ios_base::beg) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			return std::make_pair(cache -> load(offset) , offset);
		}